

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

void __thiscall QCborStreamReaderPrivate::initDecoder(QCborStreamReaderPrivate *this)

{
  ArrayOptions *pAVar1;
  ulong uVar2;
  Code CVar3;
  Data *pDVar4;
  long lVar5;
  ulong alloc;
  
  QList<CborValue>::clear(&(this->containerStack).super_QList<CborValue>);
  this->bufferStart = 0;
  if (this->device != (QIODevice *)0x0) {
    QByteArray::clear(&this->buffer);
    pDVar4 = (this->buffer).d.d;
    if (((pDVar4 == (Data *)0x0) ||
        (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       (lVar5 = (pDVar4->super_QArrayData).alloc,
       (long)((((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar5)
             - (long)(this->buffer).d.ptr) < 0x100)) {
      uVar2 = (this->buffer).d.size;
      alloc = 0x100;
      if (0x100 < uVar2) {
        alloc = uVar2;
      }
      QByteArray::reallocData(&this->buffer,alloc,KeepSize);
      pDVar4 = (this->buffer).d.d;
      if (pDVar4 == (Data *)0x0) goto LAB_0049d2e8;
      lVar5 = (pDVar4->super_QArrayData).alloc;
    }
    if (lVar5 != 0) {
      pAVar1 = &(pDVar4->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
LAB_0049d2e8:
  preread(this);
  (this->parser).source.end = (uint8_t *)0x0;
  *(undefined8 *)&(this->parser).flags = 0;
  (this->parser).source.end = (uint8_t *)0x0;
  (this->parser).flags = CborParserFlag_ExternalSource;
  (this->currentElement).parser = &this->parser;
  (this->currentElement).source.ptr = (uint8_t *)this;
  (this->currentElement).remaining = 1;
  CVar3 = preparse_value(&this->currentElement);
  if ((CVar3 != NoError) && (CVar3 != EndOfFile)) {
    this->corrupt = true;
  }
  (this->lastError).c = CVar3;
  return;
}

Assistant:

void initDecoder()
    {
        containerStack.clear();
        bufferStart = 0;
        if (device) {
            buffer.clear();
            buffer.reserve(IdealIoBufferSize);      // sets the CapacityReserved flag
        }

        preread();
        if (CborError err = cbor_parser_init_reader(nullptr, &parser, &currentElement, this))
            handleError(err);
        else
            lastError = { QCborError::NoError };
    }